

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O0

CURLcode Curl_getformdata(CURL *data,curl_mimepart *finalform,curl_httppost *post,
                         curl_read_callback fread_func)

{
  int iVar1;
  curl_mime *subparts;
  curl_mimepart *pcVar2;
  size_t local_88;
  size_t local_68;
  size_t uclen;
  curl_off_t clen;
  curl_mime *multipart;
  curl_httppost *file;
  curl_mimepart *part;
  curl_mime *form;
  CURLcode result;
  curl_read_callback fread_func_local;
  curl_httppost *post_local;
  curl_mimepart *finalform_local;
  CURL *data_local;
  
  form._4_4_ = CURLE_OK;
  Curl_mime_cleanpart(finalform);
  if (post == (curl_httppost *)0x0) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    subparts = curl_mime_init(data);
    if (subparts == (curl_mime *)0x0) {
      form._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    fread_func_local = (curl_read_callback)post;
    if (form._4_4_ == CURLE_OK) {
      form._4_4_ = curl_mime_subparts(finalform,subparts);
    }
    for (; form._4_4_ == CURLE_OK && fread_func_local != (curl_read_callback)0x0;
        fread_func_local = *(curl_read_callback *)fread_func_local) {
      clen = (curl_off_t)subparts;
      if (*(long *)(fread_func_local + 0x48) != 0) {
        pcVar2 = curl_mime_addpart(subparts);
        if (pcVar2 == (curl_mimepart *)0x0) {
          form._4_4_ = CURLE_OUT_OF_MEMORY;
        }
        if (form._4_4_ == CURLE_OK) {
          form._4_4_ = setname(pcVar2,*(char **)(fread_func_local + 8),
                               *(size_t *)(fread_func_local + 0x10));
        }
        if ((form._4_4_ == CURLE_OK) &&
           (clen = (curl_off_t)curl_mime_init(data), (curl_mime *)clen == (curl_mime *)0x0)) {
          form._4_4_ = CURLE_OUT_OF_MEMORY;
        }
        if (form._4_4_ == CURLE_OK) {
          form._4_4_ = curl_mime_subparts(pcVar2,(curl_mime *)clen);
        }
      }
      for (multipart = (curl_mime *)fread_func_local;
          form._4_4_ == CURLE_OK && multipart != (curl_mime *)0x0;
          multipart = *(curl_mime **)&multipart->state) {
        pcVar2 = curl_mime_addpart((curl_mime *)clen);
        if (pcVar2 == (curl_mimepart *)0x0) {
          form._4_4_ = CURLE_OUT_OF_MEMORY;
        }
        if (form._4_4_ == CURLE_OK) {
          form._4_4_ = curl_mime_headers(pcVar2,*(curl_slist **)(multipart->boundary + 0x28),0);
        }
        if ((form._4_4_ == CURLE_OK) && (*(long *)(multipart->boundary + 0x20) != 0)) {
          form._4_4_ = curl_mime_type(pcVar2,*(char **)(multipart->boundary + 0x20));
        }
        if ((form._4_4_ == CURLE_OK) && (*(long *)(fread_func_local + 0x48) == 0)) {
          form._4_4_ = setname(pcVar2,*(char **)(fread_func_local + 8),
                               *(size_t *)(fread_func_local + 0x10));
        }
        if (form._4_4_ == CURLE_OK) {
          uclen = *(size_t *)(fread_func_local + 0x20);
          if ((*(ulong *)(fread_func_local + 0x50) & 0x80) != 0) {
            uclen = *(size_t *)(fread_func_local + 0x68);
          }
          if ((*(ulong *)(fread_func_local + 0x50) & 3) == 0) {
            if ((*(ulong *)(fread_func_local + 0x50) & 0x10) == 0) {
              if ((*(ulong *)(fread_func_local + 0x50) & 0x40) == 0) {
                if (uclen == 0) {
                  local_68 = 0xffffffffffffffff;
                }
                else {
                  local_68 = uclen;
                }
                form._4_4_ = curl_mime_data(pcVar2,*(char **)(fread_func_local + 0x18),local_68);
              }
              else {
                if (uclen == 0) {
                  uclen = 0xffffffffffffffff;
                }
                form._4_4_ = curl_mime_data_cb(pcVar2,uclen,fread_func,(curl_seek_callback)0x0,
                                               (curl_free_callback)0x0,
                                               *(void **)(fread_func_local + 0x60));
              }
            }
            else {
              if (*(long *)(fread_func_local + 0x30) == 0) {
                local_88 = 0xffffffffffffffff;
              }
              else {
                local_88 = *(size_t *)(fread_func_local + 0x30);
              }
              form._4_4_ = curl_mime_data(pcVar2,*(char **)(fread_func_local + 0x28),local_88);
            }
          }
          else {
            iVar1 = strcmp(*(char **)multipart->boundary,"-");
            if (iVar1 == 0) {
              form._4_4_ = curl_mime_data_cb(pcVar2,-1,fread,fseeko_wrapper,(curl_free_callback)0x0,
                                             _stdin);
            }
            else {
              form._4_4_ = curl_mime_filedata(pcVar2,*(char **)multipart->boundary);
            }
            if ((form._4_4_ == CURLE_OK) && ((*(ulong *)(fread_func_local + 0x50) & 2) != 0)) {
              form._4_4_ = curl_mime_filename(pcVar2,(char *)0x0);
            }
          }
        }
        if (((form._4_4_ == CURLE_OK) && (*(long *)(fread_func_local + 0x58) != 0)) &&
           ((*(long *)(fread_func_local + 0x48) != 0 ||
            ((*(ulong *)(fread_func_local + 0x50) & 0x51) != 0)))) {
          form._4_4_ = curl_mime_filename(pcVar2,*(char **)(fread_func_local + 0x58));
        }
      }
    }
    if (form._4_4_ != CURLE_OK) {
      Curl_mime_cleanpart(finalform);
    }
    data_local._4_4_ = form._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_getformdata(CURL *data,
                          curl_mimepart *finalform,
                          struct curl_httppost *post,
                          curl_read_callback fread_func)
{
  CURLcode result = CURLE_OK;
  curl_mime *form = NULL;
  curl_mimepart *part;
  struct curl_httppost *file;

  Curl_mime_cleanpart(finalform); /* default form is empty */

  if(!post)
    return result; /* no input => no output! */

  form = curl_mime_init(data);
  if(!form)
    result = CURLE_OUT_OF_MEMORY;

  if(!result)
    result = curl_mime_subparts(finalform, form);

  /* Process each top part. */
  for(; !result && post; post = post->next) {
    /* If we have more than a file here, create a mime subpart and fill it. */
    curl_mime *multipart = form;
    if(post->more) {
      part = curl_mime_addpart(form);
      if(!part)
        result = CURLE_OUT_OF_MEMORY;
      if(!result)
        result = setname(part, post->name, post->namelength);
      if(!result) {
        multipart = curl_mime_init(data);
        if(!multipart)
          result = CURLE_OUT_OF_MEMORY;
      }
      if(!result)
        result = curl_mime_subparts(part, multipart);
    }

    /* Generate all the part contents. */
    for(file = post; !result && file; file = file->more) {
      /* Create the part. */
      part = curl_mime_addpart(multipart);
      if(!part)
        result = CURLE_OUT_OF_MEMORY;

      /* Set the headers. */
      if(!result)
        result = curl_mime_headers(part, file->contentheader, 0);

      /* Set the content type. */
      if(!result && file->contenttype)
        result = curl_mime_type(part, file->contenttype);

      /* Set field name. */
      if(!result && !post->more)
        result = setname(part, post->name, post->namelength);

      /* Process contents. */
      if(!result) {
        curl_off_t clen = post->contentslength;

        if(post->flags & CURL_HTTPPOST_LARGE)
          clen = post->contentlen;

        if(post->flags & (HTTPPOST_FILENAME | HTTPPOST_READFILE)) {
          if(!strcmp(file->contents, "-")) {
            /* There are a few cases where the code below will not work; in
               particular, freopen(stdin) by the caller is not guaranteed
               to result as expected. This feature has been kept for backward
               compatibility: use of "-" pseudo filename should be avoided. */
            result = curl_mime_data_cb(part, (curl_off_t) -1,
                                       (curl_read_callback) fread,
                                       fseeko_wrapper,
                                       NULL, (void *) stdin);
          }
          else
            result = curl_mime_filedata(part, file->contents);
          if(!result && (post->flags & HTTPPOST_READFILE))
            result = curl_mime_filename(part, NULL);
        }
        else if(post->flags & HTTPPOST_BUFFER)
          result = curl_mime_data(part, post->buffer,
                                  post->bufferlength ?
                                  post->bufferlength : -1);
        else if(post->flags & HTTPPOST_CALLBACK) {
          /* the contents should be read with the callback and the size is set
             with the contentslength */
          if(!clen)
            clen = -1;
          result = curl_mime_data_cb(part, clen,
                                     fread_func, NULL, NULL, post->userp);
        }
        else {
          size_t uclen;
          if(!clen)
            uclen = CURL_ZERO_TERMINATED;
          else
            uclen = (size_t)clen;
          result = curl_mime_data(part, post->contents, uclen);
        }
      }

      /* Set fake filename. */
      if(!result && post->showfilename)
        if(post->more || (post->flags & (HTTPPOST_FILENAME | HTTPPOST_BUFFER |
                                        HTTPPOST_CALLBACK)))
          result = curl_mime_filename(part, post->showfilename);
    }
  }

  if(result)
    Curl_mime_cleanpart(finalform);

  return result;
}